

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O0

void __thiscall ProductFormUpdate::ftran(ProductFormUpdate *this,HVector *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  vector<char,_std::allocator<char>_> *this_00;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  long in_RSI;
  byte *in_RDI;
  double dVar9;
  HighsInt iX_2;
  HighsInt iRow;
  HighsInt iEl;
  double pivot_value;
  HighsInt pivot_index;
  HighsInt iX_1;
  HighsInt iX;
  vector<char,_std::allocator<char>_> *in_index;
  int local_3c;
  int local_34;
  int local_20;
  int local_1c;
  
  if ((*in_RDI & 1) != 0) {
    this_00 = (vector<char,_std::allocator<char>_> *)(in_RSI + 0x40);
    for (local_1c = 0; local_1c < *(int *)(in_RSI + 4); local_1c = local_1c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_1c);
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(long)*pvVar4);
      *pvVar5 = '\x01';
    }
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_20);
      iVar2 = *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
      dVar9 = *pvVar7;
      if (ABS(dVar9) <= 1e-14) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
        *pvVar7 = 0.0;
      }
      else {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                            (long)local_20);
        dVar9 = dVar9 / *pvVar8;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
        *pvVar7 = dVar9;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_20);
        for (local_34 = *pvVar6;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),
                                (long)(local_20 + 1)), local_34 < *pvVar6; local_34 = local_34 + 1)
        {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_34);
          iVar2 = *pvVar6;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                              (long)local_34);
          dVar1 = *pvVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2
                             );
          *pvVar7 = -dVar9 * dVar1 + *pvVar7;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(long)iVar2);
          if (*pvVar5 == '\0') {
            pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(long)iVar2);
            *pvVar5 = '\x01';
            iVar3 = *(int *)(in_RSI + 4);
            *(int *)(in_RSI + 4) = iVar3 + 1;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar3);
            *pvVar4 = iVar2;
          }
        }
      }
    }
    for (local_3c = 0; local_3c < *(int *)(in_RSI + 4); local_3c = local_3c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_3c);
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(long)*pvVar4);
      *pvVar5 = '\0';
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::ftran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  // Use the zeroed rhs.cwork to record whether a row is in the index
  // list. If RHS fill-in occurs in a row, then we have to add it to
  // the list. We're not tracking cancellation, so we don't need to
  // know where a row appears in the list
  vector<char>& in_index = rhs.cwork;
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 1;

  for (HighsInt iX = 0; iX < update_count_; iX++) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    if (fabs(pivot_value) > kHighsTiny) {
      assert(in_index[pivot_index]);
      pivot_value /= pivot_value_[iX];
      rhs.array[pivot_index] = pivot_value;
      for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++) {
        HighsInt iRow = index_[iEl];
        rhs.array[iRow] -= pivot_value * value_[iEl];
        if (in_index[iRow]) continue;
        in_index[iRow] = 1;
        rhs.index[rhs.count++] = iRow;
      }
    } else {
      rhs.array[pivot_index] = 0;
    }
  }
  // Zero the in_index entries used to point into the index list
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 0;
}